

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIRFilter.cpp
# Opt level: O0

FIRFilter * __thiscall
SignalProcessing::FIRFilter::operator-(FIRFilter *__return_storage_ptr__,FIRFilter *this)

{
  bool bVar1;
  reference pfVar2;
  float local_78;
  float local_74;
  iterator iStack_70;
  float coefficient;
  iterator __end1;
  iterator __begin1;
  vector<float,_std::allocator<float>_> local_50;
  vector<float,_std::allocator<float>_> *local_38;
  vector<float,_std::allocator<float>_> *__range1;
  vector<float,_std::allocator<float>_> negative_coefficients;
  FIRFilter *this_local;
  
  negative_coefficients.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&__range1);
  get_coefficients(&local_50,this);
  local_38 = &local_50;
  __end1 = std::vector<float,_std::allocator<float>_>::begin(local_38);
  iStack_70 = std::vector<float,_std::allocator<float>_>::end(local_38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff90);
    if (!bVar1) break;
    pfVar2 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(&__end1);
    local_74 = *pfVar2;
    local_78 = 1.0 - local_74;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)&__range1,&local_78);
    __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::operator++
              (&__end1);
  }
  std::vector<float,_std::allocator<float>_>::~vector(&local_50);
  FIRFilter(__return_storage_ptr__,(vector<float,_std::allocator<float>_> *)&__range1);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

FIRFilter FIRFilter::operator-() const {
	std::vector<float> negative_coefficients;

	for(const auto coefficient: get_coefficients()) {
		negative_coefficients.push_back(1.0f - coefficient);
	}

	return FIRFilter(negative_coefficients);
}